

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

Employee * __thiscall Employee::operator=(Employee *this,Employee *e)

{
  string *psVar1;
  Address *address;
  Employee *e_local;
  Employee *this_local;
  
  psVar1 = Person::getName_abi_cxx11_(&e->super_Person);
  Person::setName(&this->super_Person,psVar1);
  psVar1 = Person::getId_abi_cxx11_(&e->super_Person);
  Person::setId(&this->super_Person,psVar1);
  address = Person::getAddress(&e->super_Person);
  Person::setAddress(&this->super_Person,address);
  this->hourWork = e->hourWork;
  this->salaryPerHour = e->salaryPerHour;
  this->workDone = e->workDone;
  this->workToDo = e->workToDo;
  return this;
}

Assistant:

Employee &Employee::operator=(const Employee &e) {

    this->setName(e.getName());
    this->setId(e.getId());
    this->setAddress(e.getAddress());
    hourWork = e.hourWork;
    salaryPerHour = e.salaryPerHour;
    workDone = e.workDone;
    workToDo = e.workToDo;
    return *this;
}